

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O2

ofstream * operator<<(ofstream *os,SSTableDataEntry *s)

{
  std::ostream::write((char *)os,(long)s);
  std::ostream::write((char *)os,(long)&s->timestamp);
  std::ostream::write((char *)os,(long)&s->key);
  std::ostream::write((char *)os,(long)&s->value_length);
  std::operator<<((ostream *)os,(string *)&s->value);
  return os;
}

Assistant:

std::ofstream &operator<<(std::ofstream &os, const SSTableDataEntry &s) {
    bytes_write(os, &s.delete_flag);
    bytes_write(os, &s.timestamp);
    bytes_write(os, &s.key);
    bytes_write(os, &s.value_length);
    bytes_write(os, &s.value);
    return os;
}